

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i386.h
# Opt level: O2

OpCode i386::parse_opcode(Type t,string *o)

{
  bool bVar1;
  OpCode OVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  OVar2 = unknown;
  if ((1 < t - Directive) && (t != Label)) {
    if (t != Instruction) {
LAB_00112112:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_38,"Unknown opcode: ",o);
      std::runtime_error::runtime_error(this,(string *)&bStack_38);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = std::operator==(o,"movzwl");
    if (bVar1) {
      OVar2 = movzwl;
    }
    else {
      bVar1 = std::operator==(o,"movzbl");
      if (bVar1) {
        OVar2 = movzbl;
      }
      else {
        bVar1 = std::operator==(o,"shrb");
        if (bVar1) {
          OVar2 = shrb;
        }
        else {
          bVar1 = std::operator==(o,"shrl");
          if (bVar1) {
            OVar2 = shrl;
          }
          else {
            bVar1 = std::operator==(o,"xorl");
            if (bVar1) {
              OVar2 = xorl;
            }
            else {
              bVar1 = std::operator==(o,"andl");
              if (bVar1) {
                OVar2 = andl;
              }
              else {
                bVar1 = std::operator==(o,"ret");
                if (bVar1) {
                  OVar2 = ret;
                }
                else {
                  bVar1 = std::operator==(o,"movb");
                  if (bVar1) {
                    OVar2 = movb;
                  }
                  else {
                    bVar1 = std::operator==(o,"cmpb");
                    if (bVar1) {
                      OVar2 = cmpb;
                    }
                    else {
                      bVar1 = std::operator==(o,"movl");
                      if (bVar1) {
                        OVar2 = movl;
                      }
                      else {
                        bVar1 = std::operator==(o,"jmp");
                        if (bVar1) {
                          OVar2 = jmp;
                        }
                        else {
                          bVar1 = std::operator==(o,"testb");
                          if (bVar1) {
                            OVar2 = testb;
                          }
                          else {
                            bVar1 = std::operator==(o,"incl");
                            if (bVar1) {
                              OVar2 = incl;
                            }
                            else {
                              bVar1 = std::operator==(o,"sarl");
                              if (bVar1) {
                                OVar2 = sarl;
                              }
                              else {
                                bVar1 = std::operator==(o,"decl");
                                if (bVar1) {
                                  OVar2 = decl;
                                }
                                else {
                                  bVar1 = std::operator==(o,"jne");
                                  if (bVar1) {
                                    OVar2 = jne;
                                  }
                                  else {
                                    bVar1 = std::operator==(o,"je");
                                    if (bVar1) {
                                      OVar2 = je;
                                    }
                                    else {
                                      bVar1 = std::operator==(o,"js");
                                      if (bVar1) {
                                        OVar2 = js;
                                      }
                                      else {
                                        bVar1 = std::operator==(o,"subl");
                                        if (bVar1) {
                                          OVar2 = subl;
                                        }
                                        else {
                                          bVar1 = std::operator==(o,"subb");
                                          if (bVar1) {
                                            OVar2 = subb;
                                          }
                                          else {
                                            bVar1 = std::operator==(o,"addl");
                                            if (bVar1) {
                                              OVar2 = addl;
                                            }
                                            else {
                                              bVar1 = std::operator==(o,"addb");
                                              if (bVar1) {
                                                OVar2 = addb;
                                              }
                                              else {
                                                bVar1 = std::operator==(o,"sall");
                                                if (bVar1) {
                                                  OVar2 = sall;
                                                }
                                                else {
                                                  bVar1 = std::operator==(o,"orl");
                                                  if (bVar1) {
                                                    OVar2 = orl;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(o,"andb");
                                                    if (bVar1) {
                                                      OVar2 = andb;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(o,"orb");
                                                      if (bVar1) {
                                                        OVar2 = orb;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(o,"decb");
                                                        if (bVar1) {
                                                          OVar2 = decb;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(o,"incb");
                                                          if (bVar1) {
                                                            OVar2 = incb;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(o,"rep");
                                                            if (bVar1) {
                                                              OVar2 = rep;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(o,"notb");
                                                              if (bVar1) {
                                                                OVar2 = notb;
                                                              }
                                                              else {
                                                                bVar1 = std::operator==(o,"negb");
                                                                if (bVar1) {
                                                                  OVar2 = negb;
                                                                }
                                                                else {
                                                                  bVar1 = std::operator==(o,"sbbb");
                                                                  if (bVar1) {
                                                                    OVar2 = sbbb;
                                                                  }
                                                                  else {
                                                                    bVar1 = std::operator==(o,
                                                  "pushl");
                                                  if (bVar1) {
                                                    OVar2 = pushl;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(o,"popl");
                                                    if (bVar1) {
                                                      OVar2 = popl;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(o,"retl");
                                                      if (bVar1) {
                                                        OVar2 = retl;
                                                      }
                                                      else {
                                                        bVar1 = std::operator==(o,"callw");
                                                        if (bVar1) {
                                                          OVar2 = callw;
                                                        }
                                                        else {
                                                          bVar1 = std::operator==(o,"calll");
                                                          if (bVar1) {
                                                            OVar2 = calll;
                                                          }
                                                          else {
                                                            bVar1 = std::operator==(o,"movw");
                                                            if (bVar1) {
                                                              OVar2 = movw;
                                                            }
                                                            else {
                                                              bVar1 = std::operator==(o,"hlt");
                                                              if (!bVar1) goto LAB_00112112;
                                                              OVar2 = hlt;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return OVar2;
}

Assistant:

static OpCode parse_opcode(Type t, const std::string& o) {
		switch (t) {
			case Type::Label:
			case Type::Comment:
			case Type::Directive:
				return OpCode::unknown;
			case Type::Instruction: {
				if (o == "movzwl")
					return OpCode::movzwl;
				if (o == "movzbl")
					return OpCode::movzbl;
				if (o == "shrb")
					return OpCode::shrb;
				if (o == "shrl")
					return OpCode::shrl;
				if (o == "xorl")
					return OpCode::xorl;
				if (o == "andl")
					return OpCode::andl;
				if (o == "ret")
					return OpCode::ret;
				if (o == "movb")
					return OpCode::movb;
				if (o == "cmpb")
					return OpCode::cmpb;
				if (o == "movl")
					return OpCode::movl;
				if (o == "jmp")
					return OpCode::jmp;
				if (o == "testb")
					return OpCode::testb;
				if (o == "incl")
					return OpCode::incl;
				if (o == "sarl")
					return OpCode::sarl;
				if (o == "decl")
					return OpCode::decl;
				if (o == "jne")
					return OpCode::jne;
				if (o == "je")
					return OpCode::je;
				if (o == "js")
					return OpCode::js;
				if (o == "subl")
					return OpCode::subl;
				if (o == "subb")
					return OpCode::subb;
				if (o == "addl")
					return OpCode::addl;
				if (o == "addb")
					return OpCode::addb;
				if (o == "sall")
					return OpCode::sall;
				if (o == "orl")
					return OpCode::orl;
				if (o == "andb")
					return OpCode::andb;
				if (o == "orb")
					return OpCode::orb;
				if (o == "decb")
					return OpCode::decb;
				if (o == "incb")
					return OpCode::incb;
				if (o == "rep")
					return OpCode::rep;
				if (o == "notb")
					return OpCode::notb;
				if (o == "negb")
					return OpCode::negb;
				if (o == "sbbb")
					return OpCode::sbbb;
				if (o == "pushl")
					return OpCode::pushl;
				if (o == "popl")
					return OpCode::popl;
				if (o == "retl")
					return OpCode::retl;
				if (o == "callw")
					return OpCode::callw;
				if (o == "calll")
					return OpCode::calll;
				if (o == "movw")
					return OpCode::movw;
				if (o == "hlt")
					return OpCode::hlt;
			}
		}
		throw std::runtime_error("Unknown opcode: " + o);
	}